

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<int>::Reserve(RepeatedField<int> *this,int new_size)

{
  int size;
  ArenaImpl *this_00;
  ulong uVar1;
  unsigned_long uVar2;
  LogMessage *pLVar3;
  int *piVar4;
  Rep *local_180;
  int *limit;
  int *e;
  int old_total_size;
  size_t bytes;
  byte local_139;
  LogMessage local_138;
  ArenaImpl *local_100;
  Arena *arena;
  Rep *new_rep;
  Rep *old_rep;
  RepeatedField<int> *pRStack_e0;
  int new_size_local;
  RepeatedField<int> *this_local;
  byte local_c1;
  LogMessage local_c0;
  ulong local_88;
  ArenaImpl *local_80;
  Arena *local_78;
  size_t local_70;
  size_t n;
  byte local_51;
  LogMessage local_50;
  ulong local_18;
  ArenaImpl *local_10;
  
  if (this->total_size_ < new_size) {
    old_rep._4_4_ = new_size;
    pRStack_e0 = this;
    if (this->total_size_ < 1) {
      local_180 = (Rep *)0x0;
    }
    else {
      local_180 = rep(this);
    }
    new_rep = local_180;
    local_100 = (ArenaImpl *)GetArena(this);
    old_rep._4_4_ = internal::CalculateReserveSize(this->total_size_,old_rep._4_4_);
    uVar1 = (ulong)old_rep._4_4_;
    uVar2 = std::numeric_limits<unsigned_long>::max();
    local_139 = 0;
    if (uVar2 - 8 >> 2 < uVar1) {
      internal::LogMessage::LogMessage
                (&local_138,LOGLEVEL_DFATAL,
                 "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x61f);
      local_139 = 1;
      pLVar3 = internal::LogMessage::operator<<
                         (&local_138,
                          "CHECK failed: (static_cast<size_t>(new_size)) <= ((std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element)): "
                         );
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"Requested size is too large to fit into size_t.");
      internal::LogFinisher::operator=((LogFinisher *)((long)&bytes + 3),pLVar3);
    }
    if ((local_139 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_138);
    }
    uVar1 = (long)old_rep._4_4_ * 4 + 8;
    if (local_100 == (ArenaImpl *)0x0) {
      arena = (Arena *)operator_new(uVar1);
    }
    else {
      local_80 = local_100;
      local_88 = uVar1;
      uVar2 = std::numeric_limits<unsigned_long>::max();
      local_c1 = 0;
      if (uVar2 < uVar1) {
        internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "src/../third_party/protobuf-lite/google/protobuf/arena.h",0x136);
        local_c1 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_c0,
                            "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                           );
        pLVar3 = internal::LogMessage::operator<<
                           (pLVar3,"Requested size is too large to fit into size_t.");
        internal::LogFinisher::operator=((LogFinisher *)((long)&this_local + 3),pLVar3);
      }
      if ((local_c1 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_c0);
      }
      this_00 = local_80;
      uVar1 = local_88;
      if (local_80 == (ArenaImpl *)0x0) {
        local_78 = (Arena *)operator_new__(local_88);
      }
      else {
        local_10 = local_80;
        local_18 = local_88;
        uVar2 = std::numeric_limits<unsigned_long>::max();
        local_51 = 0;
        if (uVar2 < uVar1) {
          internal::LogMessage::LogMessage
                    (&local_50,LOGLEVEL_DFATAL,
                     "src/../third_party/protobuf-lite/google/protobuf/arena.h",0x22e);
          local_51 = 1;
          pLVar3 = internal::LogMessage::operator<<
                             (&local_50,
                              "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                             );
          pLVar3 = internal::LogMessage::operator<<
                             (pLVar3,"Requested size is too large to fit into size_t.");
          internal::LogFinisher::operator=((LogFinisher *)((long)&n + 3),pLVar3);
        }
        if ((local_51 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_50);
        }
        local_70 = internal::AlignUpTo8(local_18);
        internal::ArenaImpl::RecordAlloc(this_00,(type_info *)&char::typeinfo,local_70);
        local_78 = (Arena *)Arena::AllocateAlignedTo<1ul>((Arena *)this_00,local_70);
      }
      arena = local_78;
    }
    *(ArenaImpl **)arena = local_100;
    size = this->total_size_;
    this->total_size_ = old_rep._4_4_;
    this->arena_or_elements_ = arena + 8;
    limit = elements(this);
    piVar4 = limit + this->total_size_;
    for (; limit < piVar4; limit = limit + 1) {
    }
    if (0 < this->current_size_) {
      piVar4 = elements(this);
      MoveArray(this,piVar4,new_rep->elements,this->current_size_);
    }
    InternalDeallocate(this,new_rep,size);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : NULL;
  Rep* new_rep;
  Arena* arena = GetArena();
  new_size = internal::CalculateReserveSize(total_size_, new_size);
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == NULL) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  // Already known: new_size >= internal::kMinRepeatedFieldAllocationSize
  // Maintain invariant:
  //     total_size_ == 0 ||
  //     total_size_ >= internal::kMinRepeatedFieldAllocationSize
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}